

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

int cppcms_capi_session_is_set(cppcms_capi_session *session,char *key)

{
  bool bVar1;
  string *in_RSI;
  long in_RDI;
  cppcms_capi_session *in_stack_ffffffffffffffa0;
  session_interface *this;
  undefined1 local_49 [49];
  string *local_18;
  long local_10;
  uint local_4;
  
  if (in_RDI == 0) {
    local_4 = 0xffffffff;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    anon_unknown.dwarf_2860d0::check_str((char *)in_stack_ffffffffffffffa0);
    cppcms_capi_session::check_loaded(in_stack_ffffffffffffffa0);
    booster::hold_ptr<cppcms::session_interface>::operator->
              ((hold_ptr<cppcms::session_interface> *)(local_10 + 0x78));
    this = (session_interface *)local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_49 + 1),(char *)local_18,(allocator *)this);
    bVar1 = cppcms::session_interface::is_set(this,local_18);
    local_4 = (uint)bVar1;
    std::__cxx11::string::~string((string *)(local_49 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_49);
  }
  return local_4;
}

Assistant:

int cppcms_capi_session_is_set(cppcms_capi_session *session,char const *key)
{
	TRY {
		if(!session)
			return -1;
		check_str(key);
		session->check_loaded();
		return session->p->is_set(key);
	}